

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

string * __thiscall
llama_vocab::detokenize_abi_cxx11_
          (llama_vocab *this,vector<int,_std::allocator<int>_> *tokens,bool special)

{
  undefined4 uVar1;
  int32_t iVar2;
  int32_t text_len_max;
  int iVar3;
  int *tokens_00;
  size_type sVar4;
  char *text_00;
  byte in_CL;
  vector<int,_std::allocator<int>_> *in_RDX;
  string *in_RDI;
  int32_t n_chars;
  string *text;
  undefined1 in_stack_ffffffffffffff72;
  undefined1 in_stack_ffffffffffffff73;
  int32_t in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  int32_t in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff90;
  size_type local_30;
  unsigned_long local_28;
  undefined1 local_1a;
  byte local_19;
  vector<int,_std::allocator<int>_> *local_18;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  local_18 = in_RDX;
  ::std::__cxx11::string::string((string *)in_RDI);
  local_28 = ::std::__cxx11::string::capacity();
  local_30 = ::std::vector<int,_std::allocator<int>_>::size(local_18);
  ::std::max<unsigned_long>(&local_28,&local_30);
  ::std::__cxx11::string::resize((ulong)in_RDI);
  tokens_00 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x53cfcf);
  sVar4 = ::std::vector<int,_std::allocator<int>_>::size(local_18);
  uVar1 = (undefined4)sVar4;
  ::std::__cxx11::string::operator[]((ulong)in_RDI);
  ::std::__cxx11::string::size();
  iVar2 = detokenize((llama_vocab *)CONCAT44(uVar1,in_stack_ffffffffffffff90),tokens_00,
                     in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                     (bool)in_stack_ffffffffffffff73,(bool)in_stack_ffffffffffffff72);
  if (iVar2 < 0) {
    ::std::__cxx11::string::resize((ulong)in_RDI);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x53d070);
    sVar4 = ::std::vector<int,_std::allocator<int>_>::size(local_18);
    text_len_max = (int32_t)sVar4;
    text_00 = (char *)::std::__cxx11::string::operator[]((ulong)in_RDI);
    ::std::__cxx11::string::size();
    iVar2 = detokenize((llama_vocab *)CONCAT44(uVar1,in_stack_ffffffffffffff90),tokens_00,iVar2,
                       text_00,text_len_max,(bool)in_stack_ffffffffffffff73,
                       (bool)in_stack_ffffffffffffff72);
    iVar3 = ::std::__cxx11::string::size();
    if (iVar3 < iVar2) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
                 ,0xbef,"GGML_ASSERT(%s) failed","n_chars <= (int32_t)text.size()");
    }
  }
  ::std::__cxx11::string::resize((ulong)in_RDI);
  return in_RDI;
}

Assistant:

std::string llama_vocab::detokenize(const std::vector<llama_token> & tokens, bool special) const {
    std::string text;
    text.resize(std::max(text.capacity(), tokens.size()));
    int32_t n_chars = detokenize(tokens.data(), (int32_t)tokens.size(), &text[0], (int32_t)text.size(), false, special);
    if (n_chars < 0) {
        text.resize(-n_chars);
        n_chars = detokenize(tokens.data(), (int32_t)tokens.size(), &text[0], (int32_t)text.size(), false, special);
        GGML_ASSERT(n_chars <= (int32_t)text.size());  // whitespace trimming is performed after per-token detokenization
    }

    text.resize(n_chars);

    // NOTE: the original tokenizer decodes bytes after collecting the pieces.
    return text;
}